

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sight.cpp
# Opt level: O1

int AF_AActor_CheckSight
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *t1;
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  PClass *pPVar3;
  char *pcVar4;
  AActor *t2;
  bool bVar5;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      t1 = (AActor *)(param->field_0).field_1.a;
      if (t1 != (AActor *)0x0) {
        if ((t1->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar2 = (**(t1->super_DThinker).super_DObject._vptr_DObject)(t1);
          (t1->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar2);
        }
        pPVar3 = (t1->super_DThinker).super_DObject.Class;
        bVar5 = pPVar3 != (PClass *)0x0;
        if (pPVar3 != pPVar1 && bVar5) {
          do {
            pPVar3 = pPVar3->ParentClass;
            bVar5 = pPVar3 != (PClass *)0x0;
            if (pPVar3 == pPVar1) break;
          } while (pPVar3 != (PClass *)0x0);
        }
        if (!bVar5) {
          pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00451ab9;
        }
      }
      if (numparam == 1) {
        pcVar4 = "(paramnum) < numparam";
      }
      else {
        if ((param[1].field_0.field_3.Type == '\x03') &&
           ((param[1].field_0.field_1.atag == 1 || (param[1].field_0.field_1.a == (void *)0x0)))) {
          t2 = (AActor *)param[1].field_0.field_1.a;
          if (t2 == (AActor *)0x0) {
            NullParam("\"target\"");
            t2 = (AActor *)param[1].field_0.field_1.a;
          }
          pPVar1 = AActor::RegistrationInfo.MyClass;
          if (t2 != (AActor *)0x0) {
            if ((t2->super_DThinker).super_DObject.Class == (PClass *)0x0) {
              iVar2 = (**(t2->super_DThinker).super_DObject._vptr_DObject)(t2);
              (t2->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_00,iVar2);
            }
            pPVar3 = (t2->super_DThinker).super_DObject.Class;
            bVar5 = pPVar3 != (PClass *)0x0;
            if (pPVar3 != pPVar1 && bVar5) {
              do {
                pPVar3 = pPVar3->ParentClass;
                bVar5 = pPVar3 != (PClass *)0x0;
                if (pPVar3 == pPVar1) break;
              } while (pPVar3 != (PClass *)0x0);
            }
            if (!bVar5) {
              pcVar4 = "target == NULL || target->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_00451ad8;
            }
          }
          if (numparam < 3) {
            param = defaultparam->Array;
            if (param[2].field_0.field_3.Type == '\0') goto LAB_00451a43;
            pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
          }
          else {
            if (param[2].field_0.field_3.Type == '\0') {
LAB_00451a43:
              bVar5 = P_CheckSight(t1,t2,param[2].field_0.i);
              if (numret < 1) {
                iVar2 = 0;
              }
              else {
                if (ret == (VMReturn *)0x0) {
                  __assert_fail("ret != NULL",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_sight.cpp"
                                ,0x394,
                                "int AF_AActor_CheckSight(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
                if (ret->RegType != '\0') {
                  __assert_fail("RegType == REGT_INT",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                                ,0x13f,"void VMReturn::SetInt(int)");
                }
                *(uint *)ret->Location = (uint)bVar5;
                iVar2 = 1;
              }
              return iVar2;
            }
            pcVar4 = "(param[paramnum]).Type == REGT_INT";
          }
          __assert_fail(pcVar4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_sight.cpp"
                        ,0x393,
                        "int AF_AActor_CheckSight(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar4 = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
      }
LAB_00451ad8:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_sight.cpp"
                    ,0x392,
                    "int AF_AActor_CheckSight(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_00451ab9:
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_sight.cpp"
                ,0x391,
                "int AF_AActor_CheckSight(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CheckSight)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT_NOT_NULL(target, AActor);
	PARAM_INT_DEF(flags);
	ACTION_RETURN_BOOL(P_CheckSight(self, target, flags));
}